

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

ssize_t rw::Image::read(int __fd,void *__buf,size_t __nbytes)

{
  size_t sVar1;
  char *__dest;
  char *pcVar2;
  long lVar3;
  undefined4 in_register_0000003c;
  long lVar4;
  long lVar5;
  
  sVar1 = strlen((char *)CONCAT44(in_register_0000003c,__fd));
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 999"
  ;
  __dest = (char *)(*DAT_00148858)(sVar1 + 0x14,0x10018);
  strcpy(__dest,(char *)CONCAT44(in_register_0000003c,__fd));
  sVar1 = strlen(__dest);
  __dest[sVar1] = '.';
  if (0 < *(int *)(engine + 0x100 + (long)imageModuleOffset)) {
    lVar3 = engine + imageModuleOffset;
    lVar4 = 0x18;
    lVar5 = 0;
    do {
      if (*(long *)(lVar3 + lVar4) != 0) {
        strncpy(__dest + sVar1 + 1,*(char **)(lVar3 + -8 + lVar4),0x13);
        pcVar2 = getFilename(__dest);
        if (pcVar2 != (char *)0x0) {
          lVar3 = (**(code **)(lVar4 + imageModuleOffset + engine))(pcVar2);
          (*DAT_00148850)(pcVar2);
          if (lVar3 != 0) goto LAB_0010efab;
        }
      }
      lVar5 = lVar5 + 1;
      lVar3 = engine + imageModuleOffset;
      lVar4 = lVar4 + 0x18;
    } while (lVar5 < *(int *)(engine + 0x100 + (long)imageModuleOffset));
  }
  lVar3 = 0;
LAB_0010efab:
  (*DAT_00148850)(__dest);
  return lVar3;
}

Assistant:

Image*
Image::read(const char *imageName)
{
	int i;
	char *filename, *ext, *found;
	Image *img;

	filename = rwNewT(char, strlen(imageName) + 20, MEMDUR_FUNCTION | ID_IMAGE);
	strcpy(filename, imageName);
	ext = filename + strlen(filename);
	*ext++ = '.';
	// Try all supported extensions
	for(i = 0; i < IMAGEGLOBAL(numFileFormats); i++){
		if(IMAGEGLOBAL(fileFormats)[i].read == nil)
			continue;
		strncpy(ext, IMAGEGLOBAL(fileFormats)[i].extension, 19);
		found = getFilename(filename);
		// Found a file
		if(found){
			img = IMAGEGLOBAL(fileFormats)[i].read(found);
			rwFree(found);
			// It was a valid image of that format
			if(img){
				rwFree(filename);
				return img;
			}
		}
	}
	rwFree(filename);
	return nil;
}